

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

bool __thiscall
spvtools::EnumSet<spvtools::Extension>::contains(EnumSet<spvtools::Extension> *this,Extension value)

{
  Extension EVar1;
  ulong uVar2;
  Extension EVar3;
  size_t __n;
  size_type sVar4;
  const_reference pvVar5;
  BucketType BVar6;
  value_type *bucket;
  size_t index;
  Extension value_local;
  EnumSet<spvtools::Extension> *this_local;
  
  __n = FindBucketForValue(this,value);
  sVar4 = std::
          vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
          ::size(&this->buckets_);
  if (__n < sVar4) {
    pvVar5 = std::
             vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
             ::operator[](&this->buckets_,__n);
    EVar1 = pvVar5->start;
    EVar3 = ComputeBucketStart(value);
    if (EVar1 == EVar3) {
      pvVar5 = std::
               vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
               ::operator[](&this->buckets_,__n);
      uVar2 = pvVar5->data;
      BVar6 = ComputeMaskForValue(value);
      return (uVar2 & BVar6) != 0;
    }
  }
  return false;
}

Assistant:

bool contains(T value) const {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return false;
    }
    auto& bucket = buckets_[index];
    return bucket.data & ComputeMaskForValue(value);
  }